

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O0

void vbyte_encode_u32(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint32_t x)

{
  uint in_ESI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  value_type_conflict3 *in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  
  if (in_ESI < 0x80) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else if (in_ESI < 0x4000) {
    extract7bits<0u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    extract7bitsmaskless<1u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else if (in_ESI < 0x200000) {
    extract7bits<0u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    extract7bits<1u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    extract7bitsmaskless<2u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else if (in_ESI < 0x10000000) {
    extract7bits<0u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    extract7bits<1u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    extract7bits<2u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    extract7bitsmaskless<3u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    extract7bits<0u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,in_stack_ffffffffffffff68);
    extract7bits<1u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,in_stack_ffffffffffffff68);
    extract7bits<2u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,in_stack_ffffffffffffff68);
    extract7bits<3u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,in_stack_ffffffffffffff68);
    extract7bitsmaskless<4u>(in_ESI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RDI,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void vbyte_encode_u32(std::vector<uint8_t>& out, uint32_t x)
{
    if (x < (1U << 7)) {
        out.push_back(static_cast<uint8_t>(x & 127));
    } else if (x < (1U << 14)) {
        out.push_back(extract7bits<0>(x) | 128);
        out.push_back(extract7bitsmaskless<1>(x) & 127);
    } else if (x < (1U << 21)) {
        out.push_back(extract7bits<0>(x) | 128);
        out.push_back(extract7bits<1>(x) | 128);
        out.push_back(extract7bitsmaskless<2>(x) & 127);
    } else if (x < (1U << 28)) {
        out.push_back(extract7bits<0>(x) | 128);
        out.push_back(extract7bits<1>(x) | 128);
        out.push_back(extract7bits<2>(x) | 128);
        out.push_back(extract7bitsmaskless<3>(x) & 127);
    } else {
        out.push_back(extract7bits<0>(x) | 128);
        out.push_back(extract7bits<1>(x) | 128);
        out.push_back(extract7bits<2>(x) | 128);
        out.push_back(extract7bits<3>(x) | 128);
        out.push_back(extract7bitsmaskless<4>(x) & 127);
    }
}